

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

void __thiscall
Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
          (Matrix_Dense<double,_2UL,_2UL> *this,
          function<double_(unsigned_long,_unsigned_long)> *lambda,size_t row,size_t column)

{
  ostream *poVar1;
  array<double,_2UL> *this_00;
  reference pvVar2;
  double dVar3;
  size_type local_70;
  size_t i_column;
  size_t i_row;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t column_local;
  size_t row_local;
  function<double_(unsigned_long,_unsigned_long)> *lambda_local;
  Matrix_Dense<double,_2UL,_2UL> *this_local;
  
  local_28 = column;
  column_local = row;
  row_local = (size_t)lambda;
  lambda_local = (function<double_(unsigned_long,_unsigned_long)> *)this;
  std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::array
            (&this->super_array<Disa::Vector_Dense<double,_2UL>,_2UL>);
  if ((column_local == 2) && (local_28 == 2)) {
    for (i_column = 0; i_column < column_local; i_column = i_column + 1) {
      for (local_70 = 0; local_70 < local_28; local_70 = local_70 + 1) {
        dVar3 = std::function<double_(unsigned_long,_unsigned_long)>::operator()
                          ((function<double_(unsigned_long,_unsigned_long)> *)row_local,i_column,
                           local_70);
        this_00 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                             (&this->super_array<Disa::Vector_Dense<double,_2UL>,_2UL>,i_column)->
                   super_array<double,_2UL>;
        pvVar2 = std::array<double,_2UL>::operator[](this_00,local_70);
        *pvVar2 = dVar3;
      }
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_50 = &PTR_s__workspace_llm4binary_github_lic_001ee388;
  console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,(source_location *)column);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,
                           "Cannot change the number of rows and columns for a static matrix.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_48);
  exit(1);
}

Assistant:

explicit Matrix_Dense(const std::function<Scalar(std::size_t, std::size_t)>& lambda, std::size_t row = _row,
                        std::size_t column = _col) {
    ASSERT_DEBUG(row == _row && column == _col, "Cannot change the number of rows and columns for a static matrix.");
    FOR(i_row, row) {
      FOR(i_column, column)(*this)[i_row][i_column] = lambda(i_row, i_column);
    }
  }